

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O2

void __thiscall Thread::~Thread(Thread *this)

{
  this->_vptr_Thread = (_func_int **)&PTR__Thread_001b56c0;
  if (this->mRunning == true) {
    pthread_cancel(this->mThread);
  }
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->mLoop).super___weak_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

Thread::~Thread()
{
    if (mRunning)
        pthread_cancel(mThread);
}